

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  TargetType targetType;
  int iVar7;
  string *psVar8;
  undefined4 extraout_var;
  char *pcVar9;
  ostream *poVar10;
  cmGlobalNinjaGenerator *pcVar11;
  char *pcVar12;
  char *pcVar13;
  cmOutputConverter *pcVar14;
  pointer pbVar15;
  _Alloc_hider str;
  allocator local_802;
  allocator local_801;
  cmMakefile *local_800;
  string ppVar;
  allocator local_7ca;
  allocator local_7c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string ppDeptype;
  string ppCmd;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string ppDepfile;
  string ppCmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  string local_678;
  string cldeps;
  string local_638;
  string depfile;
  string deptype;
  string cmdLine;
  ostringstream description;
  size_type local_4e0;
  string local_370;
  string flags;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [22];
  string local_1b8;
  string rspfile;
  string responseFlag;
  string rspcontent;
  string local_138;
  RuleVariables local_118;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_118);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_118.CMTargetName = (psVar8->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_118.CMTargetType = cmState::GetTargetTypeName(targetType);
  local_118.Language = (lang->_M_dataplus)._M_p;
  local_118.Source = "$in";
  local_118.Object = "$out";
  local_118.Defines = "$DEFINES";
  local_118.Includes = "$INCLUDES";
  local_118.TargetPDB = "$TARGET_PDB";
  local_118.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_118.ObjectDir = "$OBJECT_DIR";
  local_118.ObjectFileDir = "$OBJECT_FILE_DIR";
  bVar4 = std::operator==(lang,"Fortran");
  bVar5 = std::operator==(lang,"Fortran");
  local_800 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)&flags,"$FLAGS",(allocator *)&comment);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent.field_2._M_local_buf[0] = '\0';
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  bVar6 = std::operator==(lang,"RC");
  if (((!bVar6) && (bVar6 = std::operator==(lang,"CUDA"), !bVar6)) &&
     (bVar6 = ForceResponseFile(this), bVar6)) {
    std::__cxx11::string::assign((char *)&rspfile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,"@"
                   ,&rspfile);
    std::__cxx11::string::operator=((string *)&responseFlag,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::assign((char *)&rspcontent);
    std::__cxx11::string::_M_assign((string *)&flags);
    local_118.Defines = "";
    local_118.Includes = "";
  }
  deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
  deptype._M_string_length = 0;
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  deptype.field_2._M_local_buf[0] = '\0';
  depfile.field_2._M_local_buf[0] = '\0';
  cldeps.field_2._M_local_buf[0] = '\0';
  if (!bVar4) {
    bVar6 = NeedDepTypeMSVC(this,lang);
    if (bVar6) {
      std::__cxx11::string::assign((char *)&deptype);
      std::__cxx11::string::assign((char *)&depfile);
      std::__cxx11::string::append((char *)&flags);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     "CMAKE_NINJA_CMCLDEPS_",lang);
      bVar6 = cmMakefile::IsOn(local_800,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      if (bVar6) {
        bVar6 = cmMakefile::GetIsSourceFileTryCompile(local_800);
        if (bVar6) goto LAB_003b1d75;
        std::__cxx11::string::assign((char *)&deptype);
        std::__cxx11::string::assign((char *)&depfile);
        std::__cxx11::string::string
                  ((string *)&description,"CMAKE_C_COMPILER",(allocator *)&cmdLine);
        pcVar9 = cmMakefile::GetDefinition(local_800,(string *)&description);
        if (pcVar9 == (char *)0x0) {
          std::__cxx11::string::string((string *)&local_678,"CMAKE_CXX_COMPILER",&local_801);
          pcVar9 = cmMakefile::GetSafeDefinition(local_800,&local_678);
        }
        else {
          std::__cxx11::string::string((string *)&local_678,"CMAKE_C_COMPILER",&local_801);
          pcVar9 = cmMakefile::GetSafeDefinition(local_800,&local_678);
        }
        std::__cxx11::string::string((string *)&comment,pcVar9,(allocator *)&tdi);
        std::__cxx11::string::~string((string *)&local_678);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::assign((char *)&cldeps);
        cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::append((string *)&cldeps);
        std::operator+(&launcher,"\" ",lang);
        std::operator+(&tdi,&launcher," ");
        std::operator+(&cmdLine,&tdi,local_118.Source);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &description,&cmdLine," \"$DEP_FILE\" $out \"");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&cmdLine);
        std::__cxx11::string::~string((string *)&tdi);
        std::__cxx11::string::~string((string *)&launcher);
        std::__cxx11::string::string
                  ((string *)&description,"CMAKE_CL_SHOWINCLUDES_PREFIX",(allocator *)&cmdLine);
        cmMakefile::GetSafeDefinition(local_800,(string *)&description);
        std::__cxx11::string::append((char *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        std::operator+(&cmdLine,"\" \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &description,&cmdLine,"\" ");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        psVar8 = &cmdLine;
      }
      else {
        std::__cxx11::string::assign((char *)&deptype);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,"CMAKE_NINJA_DEPTYPE_",lang);
        pcVar9 = cmMakefile::GetDefinition(local_800,(string *)&comment);
        std::__cxx11::string::~string((string *)&comment);
        if (pcVar9 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&deptype);
        }
        std::__cxx11::string::assign((char *)&depfile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,"CMAKE_DEPFILE_FLAGS_",lang);
        pcVar9 = cmMakefile::GetSafeDefinition(local_800,(string *)&comment);
        std::__cxx11::string::string((string *)&description,pcVar9,(allocator *)&cmdLine);
        if (local_4e0 != 0) {
          cmsys::SystemTools::ReplaceString((string *)&description,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)&description,"<OBJECT>","$out");
          std::__cxx11::string::string
                    ((string *)&cmdLine,"CMAKE_C_COMPILER",(allocator *)&local_678);
          pcVar9 = cmMakefile::GetDefinition(local_800,&cmdLine);
          cmsys::SystemTools::ReplaceString((string *)&description,"<CMAKE_C_COMPILER>",pcVar9);
          std::__cxx11::string::~string((string *)&cmdLine);
          std::operator+(&cmdLine," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &description);
          std::__cxx11::string::append((string *)&flags);
          std::__cxx11::string::~string((string *)&cmdLine);
        }
        psVar8 = (string *)&description;
      }
      std::__cxx11::string::~string((string *)psVar8);
      std::__cxx11::string::~string((string *)&comment);
    }
  }
LAB_003b1d75:
  local_118.Flags = flags._M_dataplus._M_p;
  local_118.DependencyFile = depfile._M_dataplus._M_p;
  iVar7 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
            _vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander.x_ = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar7);
  pcVar1 = this->LocalGenerator;
  GetTargetDependInfoPath((string *)&description,this,lang);
  ConvertToNinjaPath((string *)&comment,this,(string *)&description);
  cmOutputConverter::ConvertToOutputFormat
            (&tdi,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter,(string *)&comment,SHELL);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::~string((string *)&description);
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&comment,"RULE_LAUNCH_COMPILE",(allocator *)&description);
  pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,pcVar2,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    std::__cxx11::string::assign((char *)&launcher);
    std::__cxx11::string::append((char *)&launcher);
  }
  if (bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "CMAKE_",lang);
    std::operator+(&ppVar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &comment,"_PREPROCESS_SOURCE");
    std::__cxx11::string::~string((string *)&comment);
    pcVar9 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&ppVar);
    std::__cxx11::string::string((string *)&ppCmd,pcVar9,(allocator *)&comment);
    ppDeptype._M_dataplus._M_p = (pointer)&ppDeptype.field_2;
    ppDeptype._M_string_length = 0;
    ppDeptype.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&ppDepfile,"$DEP_FILE",(allocator *)&comment);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&cmdLine);
    cmdLine._M_dataplus._M_p = local_118.CMTargetName;
    cmdLine._M_string_length = (size_type)local_118.CMTargetType;
    local_118.Source = "$in";
    pcVar9 = "";
    local_118.Defines = "";
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&ppCmd,&ppCmds,false);
    for (pbVar15 = ppCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 !=
        ppCmds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,pbVar15);
      std::__cxx11::string::operator=((string *)pbVar15,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      pcVar14 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar14 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (rulePlaceholderExpander.x_,pcVar14,pbVar15,(RuleVariables *)&cmdLine);
    }
    pcVar1 = this->LocalGenerator;
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&compileCmds,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    std::operator+(&local_718,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compileCmds
                   ," -E cmake_ninja_depends --tdi=");
    std::operator+(&ppCmdLine,&local_718,&tdi);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&ppCmdLine," --pp=$out --dep=$DEP_FILE");
    if (bVar5) {
      pcVar9 = " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&local_718);
    cmLocalNinjaGenerator::BuildCommandLine(&ppCmdLine,this->LocalGenerator,&ppCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar10 = std::operator<<((ostream *)&comment,"Rule for preprocessing ");
    poVar10 = std::operator<<(poVar10,(string *)lang);
    std::operator<<(poVar10," files.");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar10 = std::operator<<((ostream *)&description,"Building ");
    poVar10 = std::operator<<(poVar10,(string *)lang);
    std::operator<<(poVar10," preprocessed $out");
    pcVar11 = GetGlobalGenerator(this);
    LanguagePreprocessRule(&local_718,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_1b8,"",&local_802);
    std::__cxx11::string::string((string *)&ddCmds,"",&local_7c9);
    std::__cxx11::string::string((string *)&local_138,"",&local_7ca);
    cmGlobalNinjaGenerator::AddRule
              (pcVar11,&local_718,&ppCmdLine,&local_638,&local_370,&ppDepfile,&ppDeptype,&local_1b8,
               (string *)&ddCmds,&local_138,false);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&ddCmds);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&compileCmds);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppCmds);
    std::__cxx11::string::~string((string *)&ppDepfile);
    std::__cxx11::string::~string((string *)&ppDeptype);
    std::__cxx11::string::~string((string *)&ppCmd);
    std::__cxx11::string::~string((string *)&ppVar);
  }
  if (bVar5) {
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmdLine,"$out.rsp",(allocator *)&comment);
    std::__cxx11::string::string((string *)&ppVar,"$in",(allocator *)&comment);
    std::operator+(&ppCmd,"@",&cmdLine);
    pcVar1 = this->LocalGenerator;
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&ppDeptype,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar8,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compileCmds
                   ,&ppDeptype," -E cmake_ninja_dyndep --tdi=");
    std::operator+(&ppDepfile,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&compileCmds
                   ,&tdi);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&ppDepfile," --dd=$out ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&ppCmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ddCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&ppDepfile);
    std::__cxx11::string::~string((string *)&compileCmds);
    cmLocalNinjaGenerator::BuildCommandLine(&ppDepfile,this->LocalGenerator,&ddCmds);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar10 = std::operator<<((ostream *)&comment,"Rule to generate ninja dyndep files for ");
    poVar10 = std::operator<<(poVar10,(string *)lang);
    std::operator<<(poVar10,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar10 = std::operator<<((ostream *)&description,"Generating ");
    poVar10 = std::operator<<(poVar10,(string *)lang);
    std::operator<<(poVar10," dyndep file $out");
    pcVar11 = GetGlobalGenerator(this);
    LanguageDyndepRule((string *)&compileCmds,this,lang);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_638,"",(allocator *)&local_138);
    std::__cxx11::string::string((string *)&local_370,"",(allocator *)&ppCmds);
    std::__cxx11::string::string((string *)&local_1b8,"",&local_802);
    cmGlobalNinjaGenerator::AddRule
              (pcVar11,(string *)&compileCmds,&ppDepfile,&ppCmdLine,&local_718,&local_638,&local_370
               ,&cmdLine,&ppVar,&local_1b8,false);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&compileCmds);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&ppDepfile);
    std::__cxx11::string::~string((string *)&ppDeptype);
    std::__cxx11::string::~string((string *)&ppCmd);
    std::__cxx11::string::~string((string *)&ppVar);
    std::__cxx11::string::~string((string *)&cmdLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddCmds);
  }
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = std::operator==(lang,"CUDA");
  if (bVar4) {
    _comment = (pointer)local_320;
    local_320[0]._M_local_buf[0] = '\0';
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::__cxx11::string::string
              ((string *)&description,"CUDA_SEPARABLE_COMPILATION",(allocator *)&cmdLine);
    bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&description);
    std::__cxx11::string::~string((string *)&description);
    if (bVar4) {
      std::__cxx11::string::string
                ((string *)&description,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION",
                 (allocator *)&cmdLine);
    }
    else {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string
                ((string *)&description,"CUDA_PTX_COMPILATION",(allocator *)&cmdLine);
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&description);
      std::__cxx11::string::~string((string *)&description);
      if (bVar4) {
        std::__cxx11::string::string
                  ((string *)&description,"CMAKE_CUDA_COMPILE_PTX_COMPILATION",(allocator *)&cmdLine
                  );
      }
      else {
        std::__cxx11::string::string
                  ((string *)&description,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION",
                   (allocator *)&cmdLine);
      }
    }
    std::__cxx11::string::operator=((string *)&comment,(string *)&description);
    std::__cxx11::string::~string((string *)&description);
    pcVar9 = cmMakefile::GetRequiredDefinition(local_800,(string *)&comment);
    std::__cxx11::string::string((string *)&description,pcVar9,(allocator *)&cmdLine);
    cmSystemTools::ExpandListArgument((string *)&description,&compileCmds,false);
  }
  else {
    std::__cxx11::string::string((string *)&cmdLine,"CMAKE_",(allocator *)&ppVar);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&cmdLine,lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&cmdLine);
    pcVar9 = cmMakefile::GetRequiredDefinition(local_800,(string *)&comment);
    std::__cxx11::string::string((string *)&description,pcVar9,(allocator *)&cmdLine);
    cmSystemTools::ExpandListArgument((string *)&description,&compileCmds,false);
  }
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&comment);
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((bVar4 = std::operator==(lang,"C"), bVar4 || (bVar4 = std::operator==(lang,"CXX"), bVar4)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   lang,"_INCLUDE_WHAT_YOU_USE");
    pcVar9 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,lang,"_CLANG_TIDY");
    pcVar12 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                         (string *)&description);
    std::operator+(&cmdLine,lang,"_CPPLINT");
    pcVar13 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdLine);
    if (((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) ||
       (((pcVar12 != (char *)0x0 && (*pcVar12 != '\0')) ||
        ((pcVar13 != (char *)0x0 && (*pcVar13 != '\0')))))) {
      pcVar1 = this->LocalGenerator;
      psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                (&ppVar,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar8,SHELL);
      std::__cxx11::string::append((char *)&ppVar);
      if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string((string *)&ppDeptype,pcVar9,(allocator *)&ppDepfile);
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::append((string *)&ppVar);
        std::__cxx11::string::~string((string *)&ppCmd);
        std::__cxx11::string::~string((string *)&ppDeptype);
      }
      if ((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string((string *)&ppDeptype,pcVar12,(allocator *)&ppDepfile);
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::append((string *)&ppVar);
        std::__cxx11::string::~string((string *)&ppCmd);
        std::__cxx11::string::~string((string *)&ppDeptype);
      }
      if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
        std::__cxx11::string::append((char *)&ppVar);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string((string *)&ppDeptype,pcVar13,(allocator *)&ppDepfile);
        cmOutputConverter::EscapeForShell
                  (&ppCmd,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           super_cmOutputConverter,&ppDeptype,false,false,false);
        std::__cxx11::string::append((string *)&ppVar);
        std::__cxx11::string::~string((string *)&ppCmd);
        std::__cxx11::string::~string((string *)&ppDeptype);
      }
      if (((pcVar12 != (char *)0x0) && (*pcVar12 != '\0')) ||
         ((pcVar13 != (char *)0x0 && (*pcVar13 != '\0')))) {
        std::__cxx11::string::append((char *)&ppVar);
      }
      std::__cxx11::string::append((char *)&ppVar);
      std::__cxx11::string::insert
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
      std::__cxx11::string::~string((string *)&ppVar);
    }
    std::__cxx11::string::~string((string *)&cmdLine);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&comment);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((bVar4 = std::operator==(lang,"C"), bVar4 || (bVar4 = std::operator==(lang,"CXX"), bVar4)) ||
      (bVar4 = std::operator==(lang,"CUDA"), bVar4)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   lang,"_COMPILER_LAUNCHER");
    pcVar9 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      ppVar._M_dataplus._M_p = (pointer)0x0;
      ppVar._M_string_length = 0;
      ppVar.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string((string *)&description,pcVar9,(allocator *)&cmdLine);
      cmSystemTools::ExpandListArgument
                ((string *)&description,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ppVar,true);
      std::__cxx11::string::~string((string *)&description);
      sVar3 = ppVar._M_string_length;
      for (str = ppVar._M_dataplus; str._M_p != (pointer)sVar3; str._M_p = str._M_p + 0x20) {
        cmOutputConverter::EscapeForShell
                  ((string *)&description,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)str._M_p,false,false,false);
        std::__cxx11::string::operator=((string *)str._M_p,(string *)&description);
        std::__cxx11::string::~string((string *)&description);
      }
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&cmdLine,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ppVar," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,&cmdLine," ");
      std::__cxx11::string::~string((string *)&cmdLine);
      std::__cxx11::string::insert
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
      std::__cxx11::string::~string((string *)&description);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ppVar);
    }
    std::__cxx11::string::~string((string *)&comment);
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::insert
              ((ulong)compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
  }
  for (pbVar15 = compileCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar15 !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   &launcher,pbVar15);
    std::__cxx11::string::operator=((string *)pbVar15,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    pcVar14 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
      pcVar14 = (cmOutputConverter *)0x0;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (rulePlaceholderExpander.x_,pcVar14,pbVar15,&local_118);
  }
  cmLocalNinjaGenerator::BuildCommandLine(&cmdLine,this->LocalGenerator,&compileCmds);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  poVar10 = std::operator<<((ostream *)&comment,"Rule for compiling ");
  poVar10 = std::operator<<(poVar10,(string *)lang);
  std::operator<<(poVar10," files.");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  poVar10 = std::operator<<((ostream *)&description,"Building ");
  poVar10 = std::operator<<(poVar10,(string *)lang);
  std::operator<<(poVar10," object $out");
  pcVar11 = GetGlobalGenerator(this);
  LanguageCompilerRule(&ppVar,this,lang);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&ppDepfile,"",(allocator *)&ppCmdLine);
  cmGlobalNinjaGenerator::AddRule
            (pcVar11,&ppVar,&cmdLine,&ppCmd,&ppDeptype,&depfile,&deptype,&rspfile,&rspcontent,
             &ppDepfile,false);
  std::__cxx11::string::~string((string *)&ppDepfile);
  std::__cxx11::string::~string((string *)&ppDeptype);
  std::__cxx11::string::~string((string *)&ppCmd);
  std::__cxx11::string::~string((string *)&ppVar);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::__cxx11::string::~string((string *)&cmdLine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&tdi);
  cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)&cldeps);
  std::__cxx11::string::~string((string *)&depfile);
  std::__cxx11::string::~string((string *)&deptype);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&rspcontent);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";
  std::string rspfile;
  std::string rspcontent;
  std::string responseFlag;

  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    rspfile = "$RSP_FILE";
    responseFlag = "@" + rspfile;
    rspcontent = " $DEFINES $INCLUDES $FLAGS";
    flags = responseFlag;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile = "";
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " \"$DEP_FILE\" $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    const char* langdeptype = mf->GetDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
    if (langdeptype) {
      deptype = langdeptype;
    }
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    ppVars.Flags = vars.Flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::vector<std::string>::iterator i = ppCmds.begin();
         i != ppCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake + " -E cmake_ninja_depends"
              " --tdi=" +
      tdi + " --pp=$out"
            " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(this->LanguagePreprocessRule(lang),
                                        ppCmdLine, ppDesc.str(),
                                        ppComment.str(), ppDepfile, ppDeptype,
                                        /*rspfile*/ "",
                                        /*rspcontent*/ "",
                                        /*restat*/ "",
                                        /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake + " -E cmake_ninja_dyndep"
                             " --tdi=" +
                     tdi + " --dd=$out"
                           " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + lang + "_COMPILE_OBJECT";
    std::string compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_iwyu";
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // Maybe insert a compiler launcher like ccache or distcc
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      std::vector<std::string> launcher_cmd;
      cmSystemTools::ExpandListArgument(clauncher, launcher_cmd, true);
      for (std::vector<std::string>::iterator i = launcher_cmd.begin(),
                                              e = launcher_cmd.end();
           i != e; ++i) {
        *i = this->LocalGenerator->EscapeForShell(*i);
      }
      std::string const& run_launcher = cmJoin(launcher_cmd, " ") + " ";
      compileCmds.front().insert(0, run_launcher);
    }
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    *i = launcher + *i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}